

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O2

void __thiscall pg::TSPMSolver::Prog(TSPMSolver *this,int *dst,int *src,int d,int pl)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  lVar3 = (long)pl;
  if (src[lVar3] != -1) {
    iVar5 = d - pl;
    for (lVar4 = lVar3; lVar4 < d; lVar4 = lVar4 + 2) {
      dst[lVar4] = 0;
      iVar5 = iVar5 + -2;
    }
    piVar1 = this->counts;
    lVar2 = this->k;
    bVar7 = iVar5 == 0;
    for (; lVar4 < lVar2; lVar4 = lVar4 + 2) {
      iVar6 = (uint)bVar7 + src[lVar4];
      iVar5 = iVar6;
      if (piVar1[lVar4] < iVar6) {
        iVar5 = 0;
      }
      bVar7 = piVar1[lVar4] < iVar6;
      dst[lVar4] = iVar5;
    }
    if (bVar7 == false) {
      return;
    }
  }
  dst[lVar3] = -1;
  return;
}

Assistant:

void
TSPMSolver::Prog(int *dst, int *src, int d, int pl)
{
    // check if top
    if (src[pl] == -1) {
        dst[pl] = -1;
        return;
    }

    // set every value lower than <d> to 0.
    int i = pl;
    for (; i<d; i+=2) dst[i] = 0;

    int carry = (d == i) ? 1 : 0; // only increase if <d> has parity <pl>

    for (; i<k; i+=2) {
        // increase or copy for same parity
        int v = src[i] + carry;
        if (v > counts[i]) {
            dst[i] = 0;
            carry = 1;
        } else {
            dst[i] = v;
            carry = 0;
        }
    }

    // check if top
    if (carry) dst[pl] = -1;
}